

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

Quaternion * __thiscall AML::Quaternion::operator/=(Quaternion *this,double rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar3 = *(undefined1 (*) [16])((long)&this->field_0 + 0x10);
  auVar2._8_8_ = rhs;
  auVar2._0_8_ = rhs;
  auVar2 = divpd(*(undefined1 (*) [16])&this->field_0,auVar2);
  *(undefined1 (*) [16])&this->field_0 = auVar2;
  auVar1._8_8_ = rhs;
  auVar1._0_8_ = rhs;
  auVar3 = divpd(auVar3,auVar1);
  *(undefined1 (*) [16])((long)&this->field_0 + 0x10) = auVar3;
  return this;
}

Assistant:

Quaternion& Quaternion::operator/=(double rhs)
    {
        q0 /= rhs;
        q1 /= rhs;
        q2 /= rhs;
        q3 /= rhs;
        return *this;
    }